

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

uint16_t * __thiscall
duckdb_snappy::internal::WorkingMemory::GetHashTable
          (WorkingMemory *this,size_t fragment_size,int *table_size)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 0x8000;
  uVar1 = (uint)fragment_size;
  if ((uVar1 < 0x8001) && (iVar2 = 0x100, 0xff < uVar1)) {
    iVar2 = 0x1f;
    if (uVar1 - 1 != 0) {
      for (; uVar1 - 1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    iVar2 = 2 << ((byte)iVar2 & 0x1f);
  }
  switchD_012e3010::default(this->table_,0,(ulong)(uint)(iVar2 * 2));
  *table_size = iVar2;
  return this->table_;
}

Assistant:

uint16_t* WorkingMemory::GetHashTable(size_t fragment_size,
                                      int* table_size) const {
  const size_t htsize = CalculateTableSize(fragment_size);
  memset(table_, 0, htsize * sizeof(*table_));
  *table_size = htsize;
  return table_;
}